

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 tt_cmap0_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  uint uVar1;
  uint local_2c;
  uint local_28;
  FT_UInt gindex;
  FT_UInt32 result;
  FT_UInt32 charcode;
  FT_Byte *table;
  FT_UInt32 *pchar_code_local;
  TT_CMap cmap_local;
  
  gindex = *pchar_code;
  local_28 = 0;
  local_2c = 0;
  do {
    gindex = gindex + 1;
    uVar1 = local_28;
    if (0xff < gindex) break;
    local_2c = (uint)cmap->data[(ulong)gindex + 6];
    uVar1 = gindex;
  } while (local_2c == 0);
  local_28 = uVar1;
  *pchar_code = local_28;
  return local_2c;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap0_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Byte*   table    = cmap->data;
    FT_UInt32  charcode = *pchar_code;
    FT_UInt32  result   = 0;
    FT_UInt    gindex   = 0;


    table += 6;  /* go to glyph IDs */
    while ( ++charcode < 256 )
    {
      gindex = table[charcode];
      if ( gindex != 0 )
      {
        result = charcode;
        break;
      }
    }

    *pchar_code = result;
    return gindex;
  }